

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_sampler_skip.cpp
# Opt level: O0

void kokkosp_begin_parallel_for(char *name,uint32_t devID,uint64_t *kID)

{
  uint64_t *kID_local;
  uint32_t devID_local;
  char *name_local;
  
  KokkosTools::Sampler::kokkosp_begin_parallel_for(name,devID,kID);
  return;
}

Assistant:

void kokkosp_begin_parallel_for(const char* name, const uint32_t devID,
                                uint64_t* kID) {
  *kID                          = uniqID++;
  static uint64_t invocationNum = 0;
  ++invocationNum;
  if ((invocationNum % kernelSampleSkip) == 0) {
    if ((rand() / (1.0 * RAND_MAX)) < (tool_prob_num / 100.0)) {
      if (NULL != beginForCallee) {
        if (tool_verbosity > 0) {
          std::cout << "KokkosP: sample " << *kID
                    << " calling child-begin function...\n";
        }
        if (tool_globFence) {
          invoke_ktools_fence(0);
        }
        uint64_t nestedkID = 0;
        (*beginForCallee)(name, devID, &nestedkID);
        if (tool_verbosity > 0) {
          std::cout << "KokkosP: sample " << *kID
                    << " finished with child-begin function.\n";
        }
        infokIDSample.insert({*kID, nestedkID});
      }
    }
  }
}